

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct(t_java_generator *this,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int __oflag;
  t_java_generator *ptVar3;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c0;
  
  ptVar3 = (t_java_generator *)&this->package_dir_;
  std::operator+(&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptVar3,"/");
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  make_valid_java_identifier((string *)local_220,ptVar3,(string *)CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 &local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_220 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
                 ".java");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)&local_240);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_240,local_1e0._M_dataplus._M_p,(allocator *)local_220);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c0,(char *)&local_240,__oflag);
  std::__cxx11::string::~string((string *)&local_240);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_240,this);
  poVar2 = std::operator<<((ostream *)&local_1c0,(string *)&local_240);
  java_package_abi_cxx11_((string *)local_220,this);
  ptVar3 = (t_java_generator *)local_220;
  poVar2 = std::operator<<(poVar2,(string *)ptVar3);
  java_suppressions_abi_cxx11_((string *)(local_220 + 0x20),ptVar3);
  std::operator<<(poVar2,(string *)(local_220 + 0x20));
  std::__cxx11::string::~string((string *)(local_220 + 0x20));
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)&local_240);
  out = &local_1c0;
  generate_java_struct_definition(this,(ostream *)out,tstruct,is_exception,false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c0,(int)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c0);
  std::__cxx11::string::~string((string *)(local_220 + 0x40));
  return;
}

Assistant:

void t_java_generator::generate_java_struct(t_struct* tstruct, bool is_exception) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + make_valid_java_filename(tstruct->get_name())
                         + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_suppressions();

  generate_java_struct_definition(f_struct, tstruct, is_exception);
  f_struct.close();
}